

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O3

void __thiscall QMimeData::setHtml(QMimeData *this,QString *html)

{
  QMimeDataPrivate *this_00;
  long in_FS_OFFSET;
  QString local_58;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = L"text/html";
  local_58.d.size = 9;
  ::QVariant::QVariant(&local_40,html);
  QMimeDataPrivate::setData(this_00,&local_58,&local_40);
  ::QVariant::~QVariant(&local_40);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeData::setHtml(const QString &html)
{
    Q_D(QMimeData);
    d->setData(textHtmlLiteral(), html);
}